

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::SwapOneofField<true>
          (Reflection *this,Message *lhs,Message *rhs,OneofDescriptor *oneof_descriptor)

{
  bool bVar1;
  uint32_t number;
  uint32_t number_00;
  FieldDescriptor *field;
  uint32_t *puVar2;
  LocalVarWrapper temp;
  _Variadic_union<int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  undefined1 local_68;
  MessageWrapper local_60;
  MessageWrapper local_48;
  
  bVar1 = OneofDescriptor::is_synthetic(oneof_descriptor);
  if (!bVar1) {
    number = GetOneofCase(this,lhs,oneof_descriptor);
    number_00 = GetOneofCase(this,rhs,oneof_descriptor);
    local_88._M_first._M_storage = (_Uninitialized<int,_true>)0;
    local_68 = 0;
    if (number == 0) {
      field = (FieldDescriptor *)0x0;
    }
    else {
      field = Descriptor::FindFieldByNumber(this->descriptor_,number);
      local_48.reflection = this;
      local_48.message = lhs;
      local_48.field = field;
      InternalMoveOneofField<true,google::protobuf::Reflection::SwapOneofField<true>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)const::MessageWrapper,google::protobuf::Reflection::SwapOneofField<true>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)const::LocalVarWrapper>
                (this,field,&local_48,(LocalVarWrapper *)&local_88._M_first);
    }
    if (number_00 != 0) {
      local_60.field = Descriptor::FindFieldByNumber(this->descriptor_,number_00);
      local_60.reflection = this;
      local_60.message = rhs;
      local_48.reflection = this;
      local_48.message = lhs;
      local_48.field = local_60.field;
      InternalMoveOneofField<true,google::protobuf::Reflection::SwapOneofField<true>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)const::MessageWrapper,google::protobuf::Reflection::SwapOneofField<true>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)const::MessageWrapper>
                (this,local_60.field,&local_60,&local_48);
    }
    if (number != 0) {
      local_60.reflection = this;
      local_60.message = rhs;
      local_60.field = field;
      InternalMoveOneofField<true,google::protobuf::Reflection::SwapOneofField<true>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)const::LocalVarWrapper,google::protobuf::Reflection::SwapOneofField<true>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)const::MessageWrapper>
                (this,field,(LocalVarWrapper *)&local_88._M_first,&local_60);
    }
    puVar2 = MutableOneofCase(this,lhs,oneof_descriptor);
    *puVar2 = number_00;
    puVar2 = MutableOneofCase(this,rhs,oneof_descriptor);
    *puVar2 = number;
    std::__detail::__variant::
    _Variant_storage<false,_int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage((_Variant_storage<false,_int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_88._M_first);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_88._M_first,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0x42e,"!oneof_descriptor->is_synthetic()");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
            ((LogMessageFatal *)&local_88._M_first);
}

Assistant:

void Reflection::SwapOneofField(Message* lhs, Message* rhs,
                                const OneofDescriptor* oneof_descriptor) const {
  // Wraps a local variable to temporarily store oneof value.
  struct LocalVarWrapper {
#define LOCAL_VAR_ACCESSOR(type, name)                   \
  type Get##name() const { return std::get<type>(val); } \
  void Set##name(type v) { val.emplace<type>(v); }

    LOCAL_VAR_ACCESSOR(int32_t, Int32);
    LOCAL_VAR_ACCESSOR(int64_t, Int64);
    LOCAL_VAR_ACCESSOR(uint32_t, Uint32);
    LOCAL_VAR_ACCESSOR(uint64_t, Uint64);
    LOCAL_VAR_ACCESSOR(float, Float);
    LOCAL_VAR_ACCESSOR(double, Double);
    LOCAL_VAR_ACCESSOR(bool, Bool);
    LOCAL_VAR_ACCESSOR(int, Enum);
    LOCAL_VAR_ACCESSOR(Message*, Message);
    LOCAL_VAR_ACCESSOR(ArenaStringPtr, ArenaStringPtr);
    LOCAL_VAR_ACCESSOR(MicroString, MicroString);
    LOCAL_VAR_ACCESSOR(absl::Cord*, Cord);
    LOCAL_VAR_ACCESSOR(std::string, String);
    Message* UnsafeGetMessage() const { return GetMessage(); }
    void UnsafeSetMessage(Message* v) { SetMessage(v); }
    void ClearOneofCase() {}
    SwapOneofFieldVariant val;
  };

  // Wraps a message pointer to read and write a field.
  struct MessageWrapper {
#define MESSAGE_FIELD_ACCESSOR(type, name)              \
  type Get##name() const {                              \
    return reflection->GetField<type>(*message, field); \
  }                                                     \
  void Set##name(type v) { reflection->SetField<type>(message, field, v); }

    MESSAGE_FIELD_ACCESSOR(int32_t, Int32);
    MESSAGE_FIELD_ACCESSOR(int64_t, Int64);
    MESSAGE_FIELD_ACCESSOR(uint32_t, Uint32);
    MESSAGE_FIELD_ACCESSOR(uint64_t, Uint64);
    MESSAGE_FIELD_ACCESSOR(float, Float);
    MESSAGE_FIELD_ACCESSOR(double, Double);
    MESSAGE_FIELD_ACCESSOR(bool, Bool);
    MESSAGE_FIELD_ACCESSOR(int, Enum);
    MESSAGE_FIELD_ACCESSOR(ArenaStringPtr, ArenaStringPtr);
    MESSAGE_FIELD_ACCESSOR(MicroString, MicroString);
    MESSAGE_FIELD_ACCESSOR(absl::Cord*, Cord);
    std::string GetString() const {
      return reflection->GetString(*message, field);
    }
    void SetString(const std::string& v) {
      reflection->SetString(message, field, v);
    }
    Message* GetMessage() const {
      return reflection->ReleaseMessage(message, field);
    }
    void SetMessage(Message* v) {
      reflection->SetAllocatedMessage(message, v, field);
    }
    Message* UnsafeGetMessage() const {
      return reflection->UnsafeArenaReleaseMessage(message, field);
    }
    void UnsafeSetMessage(Message* v) {
      reflection->UnsafeArenaSetAllocatedMessage(message, v, field);
    }
    void ClearOneofCase() {
      *reflection->MutableOneofCase(message, field->containing_oneof()) = 0;
    }

    const Reflection* reflection;
    Message* message;
    const FieldDescriptor* field;
  };

  ABSL_DCHECK(!oneof_descriptor->is_synthetic());
  uint32_t oneof_case_lhs = GetOneofCase(*lhs, oneof_descriptor);
  uint32_t oneof_case_rhs = GetOneofCase(*rhs, oneof_descriptor);

  LocalVarWrapper temp;
  MessageWrapper lhs_wrapper, rhs_wrapper;
  const FieldDescriptor* field_lhs = nullptr;
  // lhs --> temp
  if (oneof_case_lhs > 0) {
    field_lhs = descriptor_->FindFieldByNumber(oneof_case_lhs);
    lhs_wrapper = {this, lhs, field_lhs};
    InternalMoveOneofField<unsafe_shallow_swap>(field_lhs, &lhs_wrapper, &temp);
  }
  // rhs --> lhs
  if (oneof_case_rhs > 0) {
    const FieldDescriptor* f = descriptor_->FindFieldByNumber(oneof_case_rhs);
    lhs_wrapper = {this, lhs, f};
    rhs_wrapper = {this, rhs, f};
    InternalMoveOneofField<unsafe_shallow_swap>(f, &rhs_wrapper, &lhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(lhs, oneof_descriptor);
  }
  // temp --> rhs
  if (oneof_case_lhs > 0) {
    rhs_wrapper = {this, rhs, field_lhs};
    InternalMoveOneofField<unsafe_shallow_swap>(field_lhs, &temp, &rhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(rhs, oneof_descriptor);
  }

  if (unsafe_shallow_swap) {
    *MutableOneofCase(lhs, oneof_descriptor) = oneof_case_rhs;
    *MutableOneofCase(rhs, oneof_descriptor) = oneof_case_lhs;
  }
}